

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O1

int speex_resampler_process_int
              (SpeexResamplerState *st,uint channel_index,short *in,uint *in_len,short *out,
              uint *out_len)

{
  float fVar1;
  SpeexResamplerState *st_00;
  short sVar2;
  int iVar3;
  short *psVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  uint ochunk;
  uint ichunk;
  spx_word16_t *y;
  spx_word16_t ystack [1024];
  uint local_10a8;
  uint local_10a4;
  uint local_10a0;
  int local_109c;
  short *local_1098;
  uint local_108c;
  uint local_1088;
  uint local_1084;
  spx_word16_t *local_1080;
  SpeexResamplerState *local_1078;
  ulong local_1070;
  spx_word16_t *local_1068;
  uint *local_1060;
  uint *local_1058;
  long local_1050;
  long local_1048;
  short *local_1040;
  spx_word16_t local_1038 [1026];
  
  local_1048 = (long)st->in_stride;
  local_109c = st->out_stride;
  uVar8 = *in_len;
  local_1080 = st->mem + st->mem_alloc_size * channel_index;
  uVar6 = *out_len;
  st->out_stride = 1;
  local_1060 = in_len;
  local_1058 = out_len;
  if (uVar6 != 0 && uVar8 != 0) {
    lVar7 = (long)local_109c;
    local_108c = (st->mem_alloc_size - st->filt_len) + 1;
    local_1070 = (ulong)channel_index;
    local_1050 = local_1048 * 2;
    local_10a0 = channel_index;
    local_1098 = out;
    local_1078 = st;
    do {
      st_00 = local_1078;
      local_1068 = local_1038;
      local_10a4 = local_108c;
      if (uVar8 < local_108c) {
        local_10a4 = uVar8;
      }
      local_10a8 = 0x400;
      if (uVar6 < 0x400) {
        local_10a8 = uVar6;
      }
      if (local_1078->magic_samples[local_1070] == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = speex_resampler_magic(local_1078,local_10a0,&local_1068,local_10a8);
        local_10a8 = local_10a8 - iVar3;
        uVar6 = uVar6 - iVar3;
      }
      local_1084 = uVar8;
      local_1040 = in;
      if (st_00->magic_samples[local_1070] == 0) {
        uVar5 = (ulong)local_10a4;
        if (in == (short *)0x0) {
          if (uVar5 != 0) {
            uVar8 = st_00->filt_len - 1;
            do {
              local_1080[uVar8] = 0.0;
              uVar8 = uVar8 + 1;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
        }
        else if (uVar5 != 0) {
          uVar8 = st_00->filt_len - 1;
          psVar4 = in;
          do {
            local_1080[uVar8] = (float)(int)*psVar4;
            uVar8 = uVar8 + 1;
            psVar4 = (short *)((long)psVar4 + local_1050);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        speex_resampler_process_native(st_00,local_10a0,&local_10a4,local_1068,&local_10a8);
      }
      else {
        local_10a4 = 0;
        local_10a8 = 0;
      }
      local_1088 = local_10a8;
      uVar9 = iVar3 + local_10a8;
      if (uVar9 != 0) {
        uVar5 = 0;
        psVar4 = local_1098;
        do {
          fVar1 = local_1038[uVar5];
          sVar2 = -0x8000;
          if ((-32767.5 <= fVar1) && (sVar2 = 0x7fff, fVar1 <= 32766.5)) {
            dVar10 = floor((double)fVar1 + 0.5);
            sVar2 = (short)(int)dVar10;
          }
          *psVar4 = sVar2;
          uVar5 = uVar5 + 1;
          psVar4 = psVar4 + lVar7;
        } while (uVar9 != uVar5);
      }
      uVar6 = uVar6 - local_1088;
      in = local_1040;
      if (local_1040 != (short *)0x0) {
        in = local_1040 + local_10a4 * (int)local_1048;
      }
      uVar8 = local_1084 - local_10a4;
      st = local_1078;
    } while ((uVar8 != 0) && (local_1098 = local_1098 + uVar9 * local_109c, uVar6 != 0));
  }
  st->out_stride = local_109c;
  *local_1060 = *local_1060 - uVar8;
  *local_1058 = *local_1058 - uVar6;
  return (int)(st->resampler_ptr == resampler_basic_zero);
}

Assistant:

EXPORT int speex_resampler_process_int(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_int16_t *in, spx_uint32_t *in_len, spx_int16_t *out, spx_uint32_t *out_len)
#else
EXPORT int speex_resampler_process_float(SpeexResamplerState *st, spx_uint32_t channel_index, const float *in, spx_uint32_t *in_len, float *out, spx_uint32_t *out_len)
#endif
{
   int j;
   spx_uint32_t ilen = *in_len;
   spx_uint32_t olen = *out_len;
   spx_word16_t *x = st->mem + channel_index * st->mem_alloc_size;
   const int filt_offs = st->filt_len - 1;
   const spx_uint32_t xlen = st->mem_alloc_size - filt_offs;
   const int istride = st->in_stride;

   if (st->magic_samples[channel_index])
      olen -= speex_resampler_magic(st, channel_index, &out, olen);
   if (! st->magic_samples[channel_index]) {
      while (ilen && olen) {
        spx_uint32_t ichunk = (ilen > xlen) ? xlen : ilen;
        spx_uint32_t ochunk = olen;

        if (in) {
           for(j=0;j<ichunk;++j)
              x[j+filt_offs]=in[j*istride];
        } else {
          for(j=0;j<ichunk;++j)
            x[j+filt_offs]=0;
        }
        speex_resampler_process_native(st, channel_index, &ichunk, out, &ochunk);
        ilen -= ichunk;
        olen -= ochunk;
        out += ochunk * st->out_stride;
        if (in)
           in += ichunk * istride;
      }
   }
   *in_len -= ilen;
   *out_len -= olen;
   return st->resampler_ptr == resampler_basic_zero ? RESAMPLER_ERR_ALLOC_FAILED : RESAMPLER_ERR_SUCCESS;
}